

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall
Json::BuiltStyledStreamWriter::writeArrayValue(BuiltStyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *root;
  char *pcVar4;
  ArrayIndex index;
  long lVar5;
  string local_60;
  Value *local_40;
  pointer local_38;
  
  local_40 = value;
  AVar3 = Value::size(value);
  if (AVar3 == 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"[]","");
    pushValue(this,&local_60);
  }
  else {
    if (this->cs_ != All) {
      bVar2 = isMultineArray(this,local_40);
      if (!bVar2) {
        if ((long)(this->childValues_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->childValues_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)AVar3) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_StreamWriter).sout_,"[",1)
          ;
          if ((this->indentation_)._M_string_length != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_StreamWriter).sout_," ",1);
          }
          lVar5 = 0;
          do {
            if (lVar5 != 0) {
              bVar2 = (this->indentation_)._M_string_length != 0;
              pcVar4 = ", ";
              if (!bVar2) {
                pcVar4 = ",";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_StreamWriter).sout_,pcVar4,(ulong)bVar2 + 1);
            }
            pbVar1 = (this->childValues_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_StreamWriter).sout_,
                       *(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar5),
                       *(long *)((long)&pbVar1->_M_string_length + lVar5));
            lVar5 = lVar5 + 0x20;
          } while ((ulong)(AVar3 + (AVar3 == 0)) << 5 != lVar5);
          if ((this->indentation_)._M_string_length != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->super_StreamWriter).sout_," ",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((this->super_StreamWriter).sout_,"]",1)
          ;
          return;
        }
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                      ,0x40f,"void Json::BuiltStyledStreamWriter::writeArrayValue(const Value &)");
      }
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"[","");
    writeWithIndent(this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append
              ((char *)&this->indentString_,(ulong)(this->indentation_)._M_dataplus._M_p);
    local_38 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->childValues_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    index = 0;
    lVar5 = 0;
    do {
      root = Value::operator[](local_40,index);
      writeCommentBeforeValue(this,root);
      if (local_38 == pbVar1) {
        if ((this->field_0xd8 & 2) == 0) {
          writeIndent(this);
        }
        this->field_0xd8 = this->field_0xd8 | 2;
        writeValue(this,root);
        this->field_0xd8 = this->field_0xd8 & 0xfd;
      }
      else {
        writeWithIndent(this,(string *)
                             ((long)&(((this->childValues_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar5));
      }
      if (index - AVar3 != -1) {
        std::__ostream_insert<char,std::char_traits<char>>((this->super_StreamWriter).sout_,",",1);
      }
      writeCommentAfterValueOnSameLine(this,root);
      lVar5 = lVar5 + 0x20;
      index = index + 1;
    } while (index != AVar3);
    unindent(this);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"]","");
    writeWithIndent(this,&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeArrayValue(Value const& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isMultiLine = (cs_ == CommentStyle::All) || isMultineArray(value);
    if (isMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        Value const& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_) writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *sout_ << "[";
      if (!indentation_.empty()) *sout_ << " ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *sout_ << ((!indentation_.empty()) ? ", " : ",");
        *sout_ << childValues_[index];
      }
      if (!indentation_.empty()) *sout_ << " ";
      *sout_ << "]";
    }
  }
}